

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

string * cmsys::SystemTools::Capitalized(string *__return_storage_ptr__,string *s)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  undefined1 *puVar4;
  ulong local_38;
  size_t i;
  string *s_local;
  string *n;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::size();
    std::__cxx11::string::resize((ulong)__return_storage_ptr__);
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)s);
    iVar1 = toupper((int)*pcVar3);
    puVar4 = (undefined1 *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
    *puVar4 = (char)iVar1;
    for (local_38 = 1; uVar2 = std::__cxx11::string::size(), local_38 < uVar2;
        local_38 = local_38 + 1) {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)s);
      iVar1 = tolower((int)*pcVar3);
      puVar4 = (undefined1 *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
      *puVar4 = (char)iVar1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SystemTools::Capitalized(const std::string& s)
{
  std::string n;
  if (s.empty()) {
    return n;
  }
  n.resize(s.size());
  n[0] = static_cast<std::string::value_type>(toupper(s[0]));
  for (size_t i = 1; i < s.size(); i++) {
    n[i] = static_cast<std::string::value_type>(tolower(s[i]));
  }
  return n;
}